

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LSTMWeightParams * __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
          (UniDirectionalLSTMLayerParams *this)

{
  LSTMWeightParams *this_00;
  UniDirectionalLSTMLayerParams *this_local;
  
  if (this->weightparams_ == (LSTMWeightParams *)0x0) {
    this_00 = (LSTMWeightParams *)operator_new(0x90);
    LSTMWeightParams::LSTMWeightParams(this_00);
    this->weightparams_ = this_00;
  }
  return this->weightparams_;
}

Assistant:

inline ::CoreML::Specification::LSTMWeightParams* UniDirectionalLSTMLayerParams::mutable_weightparams() {
  
  if (weightparams_ == NULL) {
    weightparams_ = new ::CoreML::Specification::LSTMWeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.UniDirectionalLSTMLayerParams.weightParams)
  return weightparams_;
}